

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  GlobalFunctionTest *in_RDI;
  ViewTest *pVVar2;
  MarrayTest *this;
  ViewTest t;
  ViewTest local_25c;
  
  GlobalFunctionTest::shapeStrideTest(in_RDI);
  ViewTest::ViewTest(&local_25c);
  ViewTest::coordinatesToOffsetTest<false>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::coordinatesToOffsetTest<true>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::coordinatesToIndexTest<false>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::coordinatesToIndexTest<true>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::indexToCoordinatesTest<false>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::indexToCoordinatesTest<true>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::indexToOffsetTest<false>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::indexToOffsetTest<true>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::emptyConstructorTest<false>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::emptyConstructorTest<true>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::scalarConstructorTest<false>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::scalarConstructorTest<true>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::shapeConstructorTest<false>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::shapeConstructorTest<true>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::shapeAssignTest<false>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::shapeAssignTest<true>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::shapeStrideConstructorTest<false>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::shapeStrideConstructorTest<true>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::shapeStrideAssignTest<false>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::shapeStrideAssignTest<true>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::copyConstructorTest(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::assignmentOperatorTest<(andres::CoordinateOrder)1>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::assignmentOperatorTest<(andres::CoordinateOrder)0>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::queryTest<false>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::queryTest<true>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::elementAccessTest<false>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::elementAccessTest<true>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::subViewsTest<false>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::subViewsTest<true>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::subConstViewsTest(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::iteratorAccessTest<false>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::iteratorAccessTest<true>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::coordinateBindingTest<false>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::coordinateBindingTest<true>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::transposeTest<false>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::transposeTest<true>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::permuteTest<false>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::permuteTest<true>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::shiftOperatorTest<false,(andres::CoordinateOrder)1>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::shiftOperatorTest<false,(andres::CoordinateOrder)0>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::shiftOperatorTest<true,(andres::CoordinateOrder)1>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::shiftOperatorTest<true,(andres::CoordinateOrder)0>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::arithmeticOperatorsTest(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::asStringTest<true>(&local_25c);
  ViewTest::ViewTest(&local_25c);
  ViewTest::asStringTest<false>(&local_25c);
  pVVar2 = &local_25c;
  ViewTest::ViewTest(pVVar2);
  ViewTest::reshapeTest(pVVar2);
  pVVar2 = &local_25c;
  ViewTest::ViewTest(pVVar2);
  ViewTest::overlapTreatmentTest(pVVar2);
  ViewTest::ViewTest(&local_25c);
  IteratorTest::IteratorTest((IteratorTest *)&local_25c);
  IteratorTest::constructorTest<false>((IteratorTest *)&local_25c);
  IteratorTest::IteratorTest((IteratorTest *)&local_25c);
  IteratorTest::constructorTest<true>((IteratorTest *)&local_25c);
  IteratorTest::IteratorTest((IteratorTest *)&local_25c);
  IteratorTest::accessIteratorOperations<false>((IteratorTest *)&local_25c);
  IteratorTest::IteratorTest((IteratorTest *)&local_25c);
  IteratorTest::accessIteratorOperations<true>((IteratorTest *)&local_25c);
  IteratorTest::IteratorTest((IteratorTest *)&local_25c);
  IteratorTest::arithmeticOperatorsTest<false>((IteratorTest *)&local_25c);
  IteratorTest::IteratorTest((IteratorTest *)&local_25c);
  IteratorTest::arithmeticOperatorsTest<true>((IteratorTest *)&local_25c);
  IteratorTest::IteratorTest((IteratorTest *)&local_25c);
  IteratorTest::comparisonOperators<false>((IteratorTest *)&local_25c);
  IteratorTest::IteratorTest((IteratorTest *)&local_25c);
  IteratorTest::comparisonOperators<true>((IteratorTest *)&local_25c);
  IteratorTest::IteratorTest((IteratorTest *)&local_25c);
  IteratorTest::hasMoreTest<false>((IteratorTest *)&local_25c);
  IteratorTest::IteratorTest((IteratorTest *)&local_25c);
  IteratorTest::hasMoreTest<true>((IteratorTest *)&local_25c);
  IteratorTest::IteratorTest((IteratorTest *)&local_25c);
  IteratorTest::indexTest<false>((IteratorTest *)&local_25c);
  IteratorTest::IteratorTest((IteratorTest *)&local_25c);
  IteratorTest::indexTest<true>((IteratorTest *)&local_25c);
  IteratorTest::IteratorTest((IteratorTest *)&local_25c);
  IteratorTest::coordinateTest<false>((IteratorTest *)&local_25c);
  IteratorTest::IteratorTest((IteratorTest *)&local_25c);
  IteratorTest::coordinateTest<true>((IteratorTest *)&local_25c);
  MarrayTest::MarrayTest((MarrayTest *)&local_25c);
  MarrayTest::constructorTest((MarrayTest *)&local_25c);
  this = (MarrayTest *)&local_25c;
  MarrayTest::MarrayTest(this);
  MarrayTest::assignTest(this);
  MarrayTest::MarrayTest((MarrayTest *)&local_25c);
  MarrayTest::copyConstructorTest<false>((MarrayTest *)&local_25c);
  MarrayTest::MarrayTest((MarrayTest *)&local_25c);
  MarrayTest::copyConstructorTest<true>((MarrayTest *)&local_25c);
  MarrayTest::MarrayTest((MarrayTest *)&local_25c);
  MarrayTest::assignmentOperatorTest<false>((MarrayTest *)&local_25c);
  MarrayTest::MarrayTest((MarrayTest *)&local_25c);
  MarrayTest::assignmentOperatorTest<true>((MarrayTest *)&local_25c);
  MarrayTest::MarrayTest((MarrayTest *)&local_25c);
  MarrayTest::reshapeTest((MarrayTest *)&local_25c);
  MarrayTest::MarrayTest((MarrayTest *)&local_25c);
  MarrayTest::resizeTest<(andres::CoordinateOrder)1>((MarrayTest *)&local_25c);
  MarrayTest::MarrayTest((MarrayTest *)&local_25c);
  MarrayTest::resizeTest<(andres::CoordinateOrder)0>((MarrayTest *)&local_25c);
  ExpressionTemplateTest::ExpressionTemplateTest((ExpressionTemplateTest *)&local_25c);
  ExpressionTemplateTest::constructionAndAssignmentTest((ExpressionTemplateTest *)&local_25c);
  ExpressionTemplateTest::ExpressionTemplateTest((ExpressionTemplateTest *)&local_25c);
  ExpressionTemplateTest::arithmeticOperatorsTest((ExpressionTemplateTest *)&local_25c);
  DifferingTypesTest::DifferingTypesTest((DifferingTypesTest *)&local_25c);
  DifferingTypesTest::constructionTest((DifferingTypesTest *)&local_25c);
  DifferingTypesTest::DifferingTypesTest((DifferingTypesTest *)&local_25c);
  DifferingTypesTest::assignmentTest((DifferingTypesTest *)&local_25c);
  DifferingTypesTest::DifferingTypesTest((DifferingTypesTest *)&local_25c);
  DifferingTypesTest::arithmeticOperatorsTest((DifferingTypesTest *)&local_25c);
  pVVar2 = &local_25c;
  DifferingTypesTest::DifferingTypesTest((DifferingTypesTest *)pVVar2);
  DifferingTypesTest::nonBasicTypesTest((DifferingTypesTest *)pVVar2);
  pVVar2 = &local_25c;
  DifferingTypesTest::DifferingTypesTest((DifferingTypesTest *)pVVar2);
  DifferingTypesTest::typePromotionTest((DifferingTypesTest *)pVVar2);
  poVar1 = std::operator<<((ostream *)&std::cout,"All tests have been passed.");
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main() 
{
    { GlobalFunctionTest t; t.shapeStrideTest(); }

    { ViewTest t; t.coordinatesToOffsetTest<false>(); }
    { ViewTest t; t.coordinatesToOffsetTest<true>(); }
    { ViewTest t; t.coordinatesToIndexTest<false>(); }
    { ViewTest t; t.coordinatesToIndexTest<true>(); }
    { ViewTest t; t.indexToCoordinatesTest<false>(); }
    { ViewTest t; t.indexToCoordinatesTest<true>(); }
    { ViewTest t; t.indexToOffsetTest<false>(); }
    { ViewTest t; t.indexToOffsetTest<true>(); }
    { ViewTest t; t.emptyConstructorTest<false>(); }
    { ViewTest t; t.emptyConstructorTest<true>(); }
    { ViewTest t; t.scalarConstructorTest<false>(); }
    { ViewTest t; t.scalarConstructorTest<true>(); }
    { ViewTest t; t.shapeConstructorTest<false>(); }
    { ViewTest t; t.shapeConstructorTest<true>(); }
    { ViewTest t; t.shapeAssignTest<false>(); }
    { ViewTest t; t.shapeAssignTest<true>(); }
    { ViewTest t; t.shapeStrideConstructorTest<false>(); }
    { ViewTest t; t.shapeStrideConstructorTest<true>(); } 
    { ViewTest t; t.shapeStrideAssignTest<false>(); }
    { ViewTest t; t.shapeStrideAssignTest<true>(); }
    { ViewTest t; t.copyConstructorTest(); } 
    { ViewTest t; t.assignmentOperatorTest<andres::LastMajorOrder>(); } 
    { ViewTest t; t.assignmentOperatorTest<andres::FirstMajorOrder>(); }
    { ViewTest t; t.queryTest<false>(); }
    { ViewTest t; t.queryTest<true>(); }
    { ViewTest t; t.elementAccessTest<false>(); }
    { ViewTest t; t.elementAccessTest<true>(); }
    { ViewTest t; t.subViewsTest<false>(); }
    { ViewTest t; t.subViewsTest<true>(); }
    { ViewTest t; t.subConstViewsTest(); }
    { ViewTest t; t.iteratorAccessTest<false>(); }
    { ViewTest t; t.iteratorAccessTest<true>(); } 
    { ViewTest t; t.coordinateBindingTest<false>(); }
    { ViewTest t; t.coordinateBindingTest<true>(); }
    { ViewTest t; t.transposeTest<false>(); }
    { ViewTest t; t.transposeTest<true>(); }
    { ViewTest t; t.permuteTest<false>(); }
    { ViewTest t; t.permuteTest<true>(); } 
    { ViewTest t; t.shiftOperatorTest<false, andres::LastMajorOrder>(); }
    { ViewTest t; t.shiftOperatorTest<false, andres::FirstMajorOrder>(); }
    { ViewTest t; t.shiftOperatorTest<true, andres::LastMajorOrder>(); }
    { ViewTest t; t.shiftOperatorTest<true, andres::FirstMajorOrder>(); } 
    { ViewTest t; t.arithmeticOperatorsTest(); }
    { ViewTest t; t.asStringTest<true>(); } 
    { ViewTest t; t.asStringTest<false>(); } 
    { ViewTest t; t.reshapeTest(); }
    { ViewTest t; t.overlapTreatmentTest(); }
    { ViewTest t; t.compatibilityFunctionsTest(); }

    { IteratorTest t; t.constructorTest<false>(); }
    { IteratorTest t; t.constructorTest<true>(); }
    { IteratorTest t; t.accessIteratorOperations<false>(); }
    { IteratorTest t; t.accessIteratorOperations<true>(); }
    { IteratorTest t; t.arithmeticOperatorsTest<false>(); }
    { IteratorTest t; t.arithmeticOperatorsTest<true>(); }
    { IteratorTest t; t.comparisonOperators<false>(); }
    { IteratorTest t; t.comparisonOperators<true>(); }
    { IteratorTest t; t.hasMoreTest<false>(); }
    { IteratorTest t; t.hasMoreTest<true>(); }
    { IteratorTest t; t.indexTest<false>(); }
    { IteratorTest t; t.indexTest<true>(); }
    { IteratorTest t; t.coordinateTest<false>(); }
    { IteratorTest t; t.coordinateTest<true>(); }

    { MarrayTest t; t.constructorTest(); } 
    { MarrayTest t; t.assignTest(); } 
    { MarrayTest t; t.copyConstructorTest<false>(); }
    { MarrayTest t; t.copyConstructorTest<true>(); }
    { MarrayTest t; t.assignmentOperatorTest<false>(); }
    { MarrayTest t; t.assignmentOperatorTest<true>(); }
    { MarrayTest t; t.reshapeTest(); } 
    { MarrayTest t; t.resizeTest<andres::LastMajorOrder>(); } 
    { MarrayTest t; t.resizeTest<andres::FirstMajorOrder>(); } 

    { ExpressionTemplateTest t; t.constructionAndAssignmentTest(); }
    { ExpressionTemplateTest t; t.arithmeticOperatorsTest(); }

    { DifferingTypesTest t; t.constructionTest(); }
    { DifferingTypesTest t; t.assignmentTest(); }
    { DifferingTypesTest t; t.arithmeticOperatorsTest(); }
    { DifferingTypesTest t; t.nonBasicTypesTest(); }
    { DifferingTypesTest t; t.typePromotionTest(); }

    #ifdef HAVE_CPP0X_INITIALIZER_LISTS
    { Cpp0xTest t; t.test(); }
    #endif

    std::cout << "All tests have been passed." << std::endl;
    return 0;
}